

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evolution-test.c++
# Opt level: O3

ChangeInfo *
capnp::compiler::anon_unknown_0::structAddField
          (ChangeInfo *__return_storage_ptr__,Builder decl,uint *nextOrdinal,bool scopeHasUnion)

{
  long lVar1;
  ArrayPtr<const_char> AVar2;
  StructReader other;
  StructReader other_00;
  CapTableBuilder *pCVar3;
  ChangeInfo *pCVar4;
  uint uVar5;
  uint index;
  WirePointer WVar6;
  ulong uVar7;
  long *plVar8;
  char *pcVar9;
  uint *params_1;
  ArrayPtr<const_char> *pAVar10;
  SegmentBuilder *pSVar11;
  ulong uVar12;
  ElementCount index_00;
  undefined8 *puVar13;
  Reader value;
  Reader value_00;
  uint ordinal;
  Builder fieldDecl;
  BuilderFor<capnp::List<capnp::compiler::Declaration,_(capnp::Kind)3>_> oldNested;
  Builder newNested;
  StructBuilder local_1e8;
  undefined8 uStack_1c0;
  uint local_1ac;
  StructBuilder local_1a8;
  ListBuilder local_178;
  WirePointer *local_148;
  SegmentBuilder *local_140;
  SegmentBuilder *local_138;
  ChangeInfo *local_130;
  StructBuilder local_128;
  OrphanBuilder local_f8;
  ListBuilder local_d8;
  StructBuilder local_a8;
  ListBuilder local_80;
  StructBuilder local_58;
  
  local_128.segment = decl._builder.segment;
  local_128.capTable = decl._builder.capTable;
  local_128.data = decl._builder.pointers + 2;
  _::PointerBuilder::disown((OrphanBuilder *)&local_1e8,(PointerBuilder *)&local_128);
  local_f8.segment = (SegmentBuilder *)local_1e8.capTable;
  local_f8.capTable = (CapTableBuilder *)local_1e8.data;
  local_f8.location = (word *)local_1e8.pointers;
  local_f8.tag.content = (uint64_t)local_1e8.segment;
  _::OrphanBuilder::asStructList(&local_178,&local_f8,(StructSize)0x80002);
  local_1e8.segment = decl._builder.segment;
  local_1e8.capTable = decl._builder.capTable;
  local_1e8.data = decl._builder.pointers + 2;
  local_130 = __return_storage_ptr__;
  _::PointerBuilder::initStructList
            (&local_d8,(PointerBuilder *)&local_1e8,local_178.elementCount + 1,(StructSize)0x80002);
  uVar5 = rand();
  index_00 = 0;
  uVar7 = (ulong)uVar5 % (ulong)(local_178.elementCount + 1);
  uVar5 = (uint)uVar7;
  if (uVar5 != 0) {
    do {
      _::ListBuilder::getStructElement((StructBuilder *)&local_80,&local_178,index_00);
      _::StructBuilder::asReader((StructBuilder *)&local_80);
      _::ListBuilder::getStructElement(&local_128,&local_d8,index_00);
      other.capTable._0_4_ = (int)local_1e8.capTable;
      other.segment = &(local_1e8.segment)->super_SegmentReader;
      other.capTable._4_4_ = (int)((ulong)local_1e8.capTable >> 0x20);
      other.data._0_4_ = (int)local_1e8.data;
      other.data._4_4_ = (int)((ulong)local_1e8.data >> 0x20);
      other.pointers._0_4_ = (int)local_1e8.pointers;
      other.pointers._4_4_ = (int)((ulong)local_1e8.pointers >> 0x20);
      other.dataSize = local_1e8.dataSize;
      other.pointerCount = local_1e8.pointerCount;
      other._38_2_ = local_1e8._38_2_;
      other._40_8_ = uStack_1c0;
      _::StructBuilder::copyContentFrom(&local_128,other);
      index_00 = index_00 + 1;
    } while (index_00 < uVar5);
  }
  index = uVar5 + 1;
  if (index < local_d8.elementCount) {
    do {
      uVar12 = (ulong)index;
      _::ListBuilder::getStructElement((StructBuilder *)&local_80,&local_178,(ElementCount)uVar7);
      _::StructBuilder::asReader((StructBuilder *)&local_80);
      _::ListBuilder::getStructElement(&local_128,&local_d8,index);
      other_00.capTable._0_4_ = (int)local_1e8.capTable;
      other_00.segment = &(local_1e8.segment)->super_SegmentReader;
      other_00.capTable._4_4_ = (int)((ulong)local_1e8.capTable >> 0x20);
      other_00.data._0_4_ = (int)local_1e8.data;
      other_00.data._4_4_ = (int)((ulong)local_1e8.data >> 0x20);
      other_00.pointers._0_4_ = (int)local_1e8.pointers;
      other_00.pointers._4_4_ = (int)((ulong)local_1e8.pointers >> 0x20);
      other_00.dataSize = local_1e8.dataSize;
      other_00.pointerCount = local_1e8.pointerCount;
      other_00._38_2_ = local_1e8._38_2_;
      other_00._40_8_ = uStack_1c0;
      _::StructBuilder::copyContentFrom(&local_128,other_00);
      index = index + 1;
      uVar7 = uVar12;
    } while (index < local_d8.elementCount);
  }
  _::ListBuilder::getStructElement(&local_1a8,&local_d8,uVar5);
  if (local_f8.segment != (SegmentBuilder *)0x0) {
    _::OrphanBuilder::euthanize(&local_f8);
  }
  local_1ac = *nextOrdinal;
  params_1 = (uint *)(ulong)(local_1ac + 1);
  *nextOrdinal = local_1ac + 1;
  local_128.segment = local_1a8.segment;
  local_128.capTable = local_1a8.capTable;
  local_128.data = local_1a8.pointers;
  _::PointerBuilder::initStruct(&local_1e8,(PointerBuilder *)&local_128,(StructSize)0x10001);
  kj::str<char_const(&)[2],unsigned_int&>
            ((String *)&local_178,(kj *)0x1dbe90,(char (*) [2])&local_1ac,params_1);
  pSVar11 = local_178.segment;
  if ((SegmentBuilder *)local_178.capTable == (SegmentBuilder *)0x0) {
    pSVar11 = (SegmentBuilder *)0x1dcce1;
  }
  value.super_StringPtr.content.size_ =
       (long)&((SegmentReader *)&(local_178.capTable)->super_CapTableReader)->arena +
       (ulong)((SegmentBuilder *)local_178.capTable == (SegmentBuilder *)0x0);
  local_128.segment = local_1e8.segment;
  local_128.capTable = local_1e8.capTable;
  local_128.data = local_1e8.pointers;
  value.super_StringPtr.content.ptr = (char *)pSVar11;
  _::PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&local_128,value);
  pCVar3 = local_178.capTable;
  pSVar11 = local_178.segment;
  if (local_178.segment != (SegmentBuilder *)0x0) {
    local_178.segment = (SegmentBuilder *)0x0;
    local_178.capTable = (CapTableBuilder *)0x0;
    (**(code **)*(WirePointer *)local_178.ptr)(local_178.ptr,pSVar11,1,pCVar3,pCVar3,0);
  }
  local_128.data = local_1a8.pointers + 1;
  *(undefined2 *)local_1a8.data = 2;
  local_128.segment = local_1a8.segment;
  local_128.capTable = local_1a8.capTable;
  _::PointerBuilder::initStruct(&local_1e8,(PointerBuilder *)&local_128,(StructSize)0x2);
  WVar6.field_1.upper32Bits = 0;
  WVar6.offsetAndKind.value = local_1ac;
  *(WirePointer *)local_1e8.data = WVar6;
  *(undefined2 *)((long)local_1a8.data + 2) = 6;
  *(undefined2 *)((long)local_1a8.data + 0xc) = 0;
  local_1e8.data = local_1a8.pointers + 5;
  local_1e8.segment = local_1a8.segment;
  local_1e8.capTable = local_1a8.capTable;
  _::PointerBuilder::clear((PointerBuilder *)&local_1e8);
  local_1e8.data = local_1a8.pointers + 6;
  local_1e8.segment = local_1a8.segment;
  local_1e8.capTable = local_1a8.capTable;
  _::PointerBuilder::clear((PointerBuilder *)&local_1e8);
  local_148 = local_1a8.pointers;
  local_1e8.data = local_1a8.pointers + 5;
  local_138 = local_1a8.segment;
  local_1e8.segment = local_1a8.segment;
  local_140 = (SegmentBuilder *)local_1a8.capTable;
  local_1e8.capTable = local_1a8.capTable;
  _::PointerBuilder::initStruct(&local_58,(PointerBuilder *)&local_1e8,(StructSize)0x20003);
  uVar5 = rand();
  uVar7 = (ulong)((uVar5 & 7) << 5);
  pAVar10 = (ArrayPtr<const_char> *)((long)&(anonymous_namespace)::TYPE_OPTIONS + uVar7);
  uVar5 = rand();
  if ((uVar5 & 3) == 0) {
    *(undefined2 *)local_58.data = 9;
    local_1e8.segment = local_58.segment;
    local_1e8.capTable = local_58.capTable;
    local_1e8.data = local_58.pointers;
    _::PointerBuilder::clear((PointerBuilder *)&local_1e8);
    local_1e8.segment = local_58.segment;
    local_1e8.capTable = local_58.capTable;
    local_1e8.data = local_58.pointers + 1;
    _::PointerBuilder::clear((PointerBuilder *)&local_1e8);
    local_1e8.segment = local_58.segment;
    local_1e8.capTable = local_58.capTable;
    local_1e8.data = local_58.pointers;
    _::PointerBuilder::initStruct(&local_128,(PointerBuilder *)&local_1e8,(StructSize)0x20003);
    *(undefined2 *)&((WireValue<uint32_t> *)local_128.data)->value = 5;
    local_178.segment = local_128.segment;
    local_178.capTable = local_128.capTable;
    local_178.ptr = (byte *)local_128.pointers;
    _::PointerBuilder::initStruct(&local_1e8,(PointerBuilder *)&local_178,(StructSize)0x10001);
    local_178.segment = local_1e8.segment;
    local_178.capTable = local_1e8.capTable;
    local_178.ptr = (byte *)local_1e8.pointers;
    value_00.super_StringPtr.content.size_ = 5;
    value_00.super_StringPtr.content.ptr = "List";
    _::PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&local_178,value_00);
    local_1e8.segment = local_58.segment;
    local_1e8.capTable = local_58.capTable;
    local_1e8.data = local_58.pointers + 1;
    _::PointerBuilder::initStructList(&local_80,(PointerBuilder *)&local_1e8,1,(StructSize)0x20001);
    _::ListBuilder::getStructElement((StructBuilder *)&local_d8,&local_80,0);
    local_1e8.data = (void *)(CONCAT44(local_d8.step,local_d8.elementCount) + 8);
    local_1e8.segment = local_d8.segment;
    local_1e8.capTable = local_d8.capTable;
    _::PointerBuilder::initStruct
              ((StructBuilder *)&local_178,(PointerBuilder *)&local_1e8,(StructSize)0x20003);
    AVar2 = *pAVar10;
    *(undefined2 *)&((WireValue<uint32_t> *)local_178.ptr)->value = 5;
    local_f8.tag.content = (uint64_t)local_178.segment;
    local_f8.segment = (SegmentBuilder *)local_178.capTable;
    _::PointerBuilder::initStruct(&local_1e8,(PointerBuilder *)&local_f8,(StructSize)0x10001);
    local_f8.tag.content = (uint64_t)local_1e8.segment;
    local_f8.segment = (SegmentBuilder *)local_1e8.capTable;
    local_f8.capTable = (CapTableBuilder *)local_1e8.pointers;
    _::PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&local_f8,(Reader)AVar2);
    plVar8 = (long *)operator_new(0x10);
    *plVar8 = (long)&PTR_operator___00204940;
    plVar8[1] = (long)pAVar10;
    puVar13 = &kj::_::
               HeapDisposer<kj::ConstFunction<void(capnp::compiler::Expression::Builder)>::Impl<capnp::compiler::(anonymous_namespace)::randomizeType(capnp::compiler::Expression::Builder)::$_0>>
               ::instance;
  }
  else {
    AVar2 = *pAVar10;
    *(undefined2 *)local_58.data = 5;
    local_128.segment = local_58.segment;
    local_128.capTable = local_58.capTable;
    local_128.data = local_58.pointers;
    _::PointerBuilder::initStruct(&local_1e8,(PointerBuilder *)&local_128,(StructSize)0x10001);
    local_128.segment = local_1e8.segment;
    local_128.capTable = local_1e8.capTable;
    local_128.data = local_1e8.pointers;
    _::PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&local_128,(Reader)AVar2);
    lVar1 = *(long *)(&DAT_00209318 + uVar7);
    plVar8 = (long *)operator_new(0x10);
    *plVar8 = (long)&PTR_operator___00205010;
    plVar8[1] = lVar1;
    puVar13 = &kj::_::
               HeapDisposer<kj::ConstFunction<void(capnp::compiler::Expression::Builder)>::Impl<kj::ConstFunction<void(capnp::compiler::Expression::Builder)>::Iface_const&>>
               ::instance;
  }
  uVar5 = rand();
  pCVar4 = local_130;
  if ((uVar5 & 3) == 0) {
    *(undefined2 *)((long)local_1a8.data + 0xc) = 1;
    local_1e8.data = local_148 + 6;
    local_1e8.segment = local_138;
    local_1e8.capTable = (CapTableBuilder *)local_140;
    _::PointerBuilder::initStruct(&local_a8,(PointerBuilder *)&local_1e8,(StructSize)0x20003);
    (**(code **)*plVar8)(plVar8);
  }
  else {
    *(undefined2 *)((long)local_1a8.data + 0xc) = 0;
  }
  pCVar4->kind = COMPATIBLE;
  kj::heapString(&pCVar4->description,10);
  pcVar9 = (char *)(pCVar4->description).content.size_;
  if (pcVar9 != (char *)0x0) {
    pcVar9 = (pCVar4->description).content.ptr;
  }
  builtin_strncpy(pcVar9,"Add field.",10);
  (**(code **)*puVar13)(puVar13,(long)plVar8 + *(long *)(*plVar8 + -0x10));
  return pCVar4;
}

Assistant:

static ChangeInfo structAddField(Declaration::Builder decl, uint& nextOrdinal, bool scopeHasUnion) {
  auto fieldDecl = addNested(decl);

  uint ordinal = nextOrdinal++;

  fieldDecl.initName().setValue(kj::str("f", ordinal));
  fieldDecl.getId().initOrdinal().setValue(ordinal);

  auto field = fieldDecl.initField();

  auto makeValue = randomizeType(field.initType());
  if (rand() % 4 == 0) {
    makeValue(field.getDefaultValue().initValue());
  } else {
    field.getDefaultValue().setNone();
  }
  return { COMPATIBLE, "Add field." };
}